

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<unsigned_long> *values)

{
  uint8 *puVar1;
  int iVar2;
  LogMessage *other;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  unsigned_long uVar8;
  pair<unsigned_long,_bool> pVar9;
  LogFinisher local_71;
  uint local_70;
  uint local_6c;
  LogMessage local_68;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (uVar8 = (unsigned_long)(char)*puVar1, -1 < (long)uVar8)) {
    input->buffer_ = puVar1 + 1;
  }
  else {
    pVar9 = io::CodedInputStream::ReadVarint64Fallback(input);
    uVar8 = pVar9.first;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return false;
    }
  }
  iVar6 = values->current_size_;
  iVar7 = values->total_size_;
  if (iVar6 == iVar7) {
    RepeatedField<unsigned_long>::Reserve(values,iVar6 + 1);
    iVar6 = values->current_size_;
    iVar7 = values->total_size_;
  }
  iVar2 = iVar6 + 1;
  values->current_size_ = iVar2;
  values->rep_->elements[iVar6] = uVar8;
  if (iVar2 < iVar7) {
    local_6c = tag & 0xff | 0x80;
    local_70 = tag >> 7;
    iVar7 = iVar7 - iVar6;
    do {
      if (tag < 0x80) {
        pbVar3 = input->buffer_;
        pbVar4 = input->buffer_end_;
        if (pbVar4 <= pbVar3) {
          return true;
        }
        if (*pbVar3 != tag) {
          return true;
        }
        pbVar3 = pbVar3 + 1;
      }
      else {
        if (0x3fff < tag) {
          return true;
        }
        pbVar3 = input->buffer_;
        pbVar4 = input->buffer_end_;
        if ((int)pbVar4 - (int)pbVar3 < 2) {
          return true;
        }
        if (local_6c != *pbVar3) {
          return true;
        }
        if (local_70 != pbVar3[1]) {
          return true;
        }
        pbVar3 = pbVar3 + 2;
      }
      input->buffer_ = pbVar3;
      if ((pbVar3 < pbVar4) && (uVar8 = (unsigned_long)(char)*pbVar3, -1 < (long)uVar8)) {
        input->buffer_ = pbVar3 + 1;
      }
      else {
        pVar9 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar8 = pVar9.first;
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        iVar2 = values->current_size_;
      }
      if (values->total_size_ <= iVar2) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x456);
        other = LogMessage::operator<<(&local_68,"CHECK failed: (current_size_) < (total_size_): ");
        LogFinisher::operator=(&local_71,other);
        LogMessage::~LogMessage(&local_68);
        iVar2 = values->current_size_;
      }
      lVar5 = (long)iVar2;
      iVar2 = iVar2 + 1;
      values->current_size_ = iVar2;
      values->rep_->elements[lVar5] = uVar8;
      iVar7 = iVar7 + -1;
    } while (1 < iVar7);
  }
  return true;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}